

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_chroma_mode_11_to_17
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  UWORD8 *pUVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  byte *pbVar12;
  UWORD8 *pUVar13;
  bool bVar14;
  byte bStack_b8;
  UWORD8 aUStack_b7 [135];
  
  iVar1 = gai4_ihevc_ang_table[mode];
  iVar11 = idx_neg_idx_chroma_11_17[(long)mode + 0x11];
  uVar7 = nt * 4;
  lVar4 = (long)(nt * 2 + -2);
  pbVar12 = pu1_ref + (long)(int)uVar7 + 1;
  for (lVar9 = 0; lVar9 < nt * 2 + 2; lVar9 = lVar9 + 2) {
    (&bStack_b8)[lVar9 + lVar4] = pbVar12[-1];
    (&bStack_b8)[nt * 2 + -1 + (int)lVar9] = *pbVar12;
    pbVar12 = pbVar12 + -2;
  }
  iVar3 = iVar11 + 0x80;
  for (lVar9 = -2; (int)(iVar1 * nt >> 4 & 0xfffffffe) < lVar9; lVar9 = lVar9 + -2) {
    uVar8 = iVar3 >> 7 & 0xfffffffe;
    (&bStack_b8)[lVar9 + lVar4] = pu1_ref[(int)(uVar8 + uVar7)];
    aUStack_b7[lVar9 + lVar4] = pu1_ref[(int)(uVar8 + (uVar7 | 1))];
    iVar3 = iVar3 + iVar11;
  }
  uVar5 = 0;
  uVar6 = (ulong)(uint)nt;
  if (nt < 1) {
    uVar6 = uVar5;
  }
  pUVar2 = pu1_dst + 1;
  for (; (long)uVar5 < (long)(nt * 2); uVar5 = uVar5 + 2) {
    uVar7 = ((int)(uVar5 >> 1) + 1) * iVar1;
    uVar8 = uVar7 & 0x1f;
    iVar11 = ((int)uVar7 >> 5) * 2 + 5;
    uVar10 = uVar6;
    pUVar13 = pUVar2;
    while (bVar14 = uVar10 != 0, uVar10 = uVar10 - 1, bVar14) {
      pUVar13[-1] = (UWORD8)((&bStack_b8)[(iVar11 + -1) + lVar4] * uVar8 +
                             (uint)(&bStack_b8)[(iVar11 + -3) + lVar4] * (0x20 - uVar8) + 0x10 >> 5)
      ;
      *pUVar13 = (UWORD8)((uint)(&bStack_b8)[(iVar11 + -2) + lVar4] * (0x20 - uVar8) +
                          (&bStack_b8)[iVar11 + lVar4] * uVar8 + 0x10 >> 5);
      iVar11 = iVar11 + 2;
      pUVar13 = pUVar13 + dst_strd;
    }
    pUVar2 = pUVar2 + 2;
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_11_to_17(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{
    /* This function and ihevc_intra_pred_CHROMA_mode_19_to_25 are same except*/
    /* for ref main & side samples assignment,can be combined for */
    /* optimzation*/

    WORD32 row, col, k;
    WORD32 intra_pred_ang, inv_ang, inv_ang_sum;
    WORD32 idx_u, idx_v, ref_main_idx_u, ref_main_idx_v, ref_idx;
    WORD32 pos_u, pos_v, fract_u, fract_v;

    UWORD8 ref_temp[2 * MAX_CU_SIZE + 2];
    UWORD8 *ref_main;
    UNUSED(src_strd);
    inv_ang_sum = 128;

    intra_pred_ang = gai4_ihevc_ang_table[mode];

    inv_ang = gai4_ihevc_inv_ang_table[mode - 11];
    /* Intermediate reference samples for negative angle modes */
    /* This have to be removed during optimization*/

    /* For horizontal modes, (ref main = ref left) (ref side = ref above) */


    ref_main = ref_temp + 2 * nt;
    for(k = 0; k < (2 * (nt + 1)); k += 2)
    {
        ref_temp[k + (2 * (nt - 1))] = pu1_ref[(4 * nt) - k];
        ref_temp[k + 1 + (2 * (nt - 1))] = pu1_ref[(4 * nt) - k + 1];
    }

    ref_main = ref_temp + (2 * (nt - 1));
    ref_idx = (nt * intra_pred_ang) >> 5;

    /* SIMD Optimization can be done using look-up table for the loop */
    /* For negative angled derive the main reference samples from side */
    /*  reference samples refer to section 8.4.4.2.6 */
    for(k = -2; k > (2 * ref_idx); k -= 2)
    {
        inv_ang_sum += inv_ang;
        ref_main[k] = pu1_ref[(4 * nt) + ((inv_ang_sum >> 8) << 1)];
        ref_main[k + 1] = pu1_ref[((4 * nt) + 1) + ((inv_ang_sum >> 8) << 1)];
    }

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */
    for(col = 0; col < (2 * nt); col += 2)
    {
        pos_u = ((col / 2 + 1) * intra_pred_ang);
        pos_v = ((col / 2 + 1) * intra_pred_ang);
        idx_u = pos_u >> 5;
        idx_v = pos_v >> 5;
        fract_u = pos_u & (31);
        fract_v = pos_v & (31);

        // Do linear filtering
        for(row = 0; row < nt; row++)
        {
            ref_main_idx_u = 2 * (row + idx_u + 1);
            ref_main_idx_v = 2 * (row + idx_v + 1) + 1;

            pu1_dst[col + (dst_strd * row)] = (UWORD8)(((32 - fract_u)
                            * ref_main[ref_main_idx_u]
                            + fract_u * ref_main[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(col + 1) + (dst_strd * row)] = (UWORD8)(((32 - fract_v)
                            * ref_main[ref_main_idx_v]
                            + fract_v * ref_main[ref_main_idx_v + 2] + 16) >> 5);

        }

    }

}